

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O0

void xml_print_node(lyout *out,int level,lyd_node *node,int toplevel,int options)

{
  LYS_NODE LVar1;
  int iVar2;
  LY_ERR *pLVar3;
  int options_local;
  int toplevel_local;
  lyd_node *node_local;
  int level_local;
  lyout *out_local;
  
  iVar2 = lyd_wd_toprint(node,options);
  if (iVar2 == 0) {
    return;
  }
  LVar1 = node->schema->nodetype;
  if (LVar1 == LYS_CONTAINER) {
LAB_001b92cb:
    xml_print_container(out,level,node,toplevel,options);
  }
  else {
    if (LVar1 == LYS_LEAF) {
      xml_print_leaf(out,level,node,toplevel,options);
      return;
    }
    if (LVar1 == LYS_LEAFLIST) {
      xml_print_list(out,level,node,0,toplevel,options);
      return;
    }
    if (LVar1 == LYS_LIST) {
      xml_print_list(out,level,node,1,toplevel,options);
      return;
    }
    if (LVar1 != LYS_ANYXML) {
      if (((LVar1 == LYS_NOTIF) || (LVar1 == LYS_RPC)) || (LVar1 == LYS_ACTION)) goto LAB_001b92cb;
      if (LVar1 != LYS_ANYDATA) {
        pLVar3 = ly_errno_location();
        *pLVar3 = LY_EINT;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_xml.c"
               ,0x22b);
        return;
      }
    }
    xml_print_anydata(out,level,node,toplevel,options);
  }
  return;
}

Assistant:

void
xml_print_node(struct lyout *out, int level, const struct lyd_node *node, int toplevel, int options)
{
    if (!lyd_wd_toprint(node, options)) {
        return;
    }

    switch (node->schema->nodetype) {
    case LYS_NOTIF:
    case LYS_RPC:
    case LYS_ACTION:
    case LYS_CONTAINER:
        xml_print_container(out, level, node, toplevel, options);
        break;
    case LYS_LEAF:
        xml_print_leaf(out, level, node, toplevel, options);
        break;
    case LYS_LEAFLIST:
        xml_print_list(out, level, node, 0, toplevel, options);
        break;
    case LYS_LIST:
        xml_print_list(out, level, node, 1, toplevel, options);
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        xml_print_anydata(out, level, node, toplevel, options);
        break;
    default:
        LOGINT;
        break;
    }
}